

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_A_ClearOverlays(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  int iVar1;
  bool bVar2;
  bool local_7a;
  bool local_77;
  DPSprite *pDStack_70;
  int u_1;
  DPSprite *pspr;
  int id;
  uint count;
  int u;
  int iStack_54;
  bool safety;
  int stop;
  int start;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_77 = true;
  if (this != (DObject *)0x0) {
    local_77 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_77 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_7a = true;
    if (this_00 != (DObject *)0x0) {
      local_7a = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_7a == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x48f,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
    iStack_54 = 0;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x490,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    iStack_54 = param[3].field_0.i;
  }
  if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
    u = 0;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x491,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    u = param[4].field_0.i;
  }
  if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
    bVar2 = true;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x492,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    bVar2 = param[5].field_0.i != 0;
  }
  if (*(long *)&this[0xc].ObjectFlags == 0) {
    if (numret < 1) {
      stack_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x495,
                      "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      VMReturn::SetInt(ret,0);
      stack_local._4_4_ = 1;
    }
  }
  else {
    if ((iStack_54 == 0) && (u == 0)) {
      iStack_54 = -0x80000000;
      u = 0x7fffffff;
      if (bVar2) {
        u = 0x7ffffffc;
      }
    }
    pspr._4_4_ = 0;
    for (pDStack_70 = TObjPtr::operator_cast_to_DPSprite_
                                ((TObjPtr *)(*(long *)&this[0xc].ObjectFlags + 0xe0));
        pDStack_70 != (DPSprite *)0x0; pDStack_70 = DPSprite::GetNext(pDStack_70)) {
      iVar1 = DPSprite::GetID(pDStack_70);
      if ((iStack_54 <= iVar1) && (iVar1 != 0)) {
        if (u < iVar1) break;
        if (bVar2) {
          if (0x7ffffffc < iVar1) break;
          if (((iVar1 == -1) || (iVar1 == 1)) || (iVar1 == 1000)) goto LAB_006a9bbc;
        }
        DPSprite::SetState(pDStack_70,(FState *)0x0,false);
        pspr._4_4_ = pspr._4_4_ + 1;
      }
LAB_006a9bbc:
    }
    if (numret < 1) {
      stack_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x4b5,
                      "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      VMReturn::SetInt(ret,pspr._4_4_);
      stack_local._4_4_ = 1;
    }
  }
  return stack_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ClearOverlays)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(start) { start = 0; }
	PARAM_INT_OPT(stop) { stop = 0; }
	PARAM_BOOL_OPT(safety) { safety = true; }

	if (self->player == nullptr)
		ACTION_RETURN_INT(0);

	if (!start && !stop)
	{
		start = INT_MIN;
		stop = safety ? PSP_TARGETCENTER - 1 : INT_MAX;
	}

	unsigned int count = 0;
	int id;

	for (DPSprite *pspr = self->player->psprites; pspr != nullptr; pspr = pspr->GetNext())
	{
		id = pspr->GetID();

		if (id < start || id == 0)
			continue;
		else if (id > stop)
			break;

		if (safety)
		{
			if (id >= PSP_TARGETCENTER)
				break;
			else if (id == PSP_STRIFEHANDS || id == PSP_WEAPON || id == PSP_FLASH)
				continue;
		}

		pspr->SetState(nullptr);
		count++;
	}

	ACTION_RETURN_INT(count);
}